

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O3

int lws_context_init_client_ssl(lws_context_creation_info *info,lws_vhost *vhost)

{
  undefined1 *puVar1;
  lws *plVar2;
  int iVar3;
  char *cert_filepath;
  char *ca_filepath;
  char *cipher_list;
  char *private_key_filepath;
  int iVar4;
  
  iVar4 = 0;
  if ((vhost->options & 0x400000) == 0) {
    private_key_filepath = (char *)0x0;
    cert_filepath = (char *)0x0;
    ca_filepath = (char *)0x0;
    if ((vhost->tls).ssl_ctx == (lws_tls_ctx *)0x0) {
      private_key_filepath = info->ssl_private_key_filepath;
      cert_filepath = info->ssl_cert_filepath;
      ca_filepath = info->ssl_ca_filepath;
    }
    cipher_list = info->client_ssl_cipher_list;
    if (cipher_list == (char *)0x0) {
      cipher_list = info->ssl_cipher_list;
    }
    if (info->client_ssl_cert_filepath != (char *)0x0) {
      cert_filepath = info->client_ssl_cert_filepath;
    }
    if (info->client_ssl_private_key_filepath != (char *)0x0) {
      private_key_filepath = info->client_ssl_private_key_filepath;
    }
    if (info->client_ssl_ca_filepath != (char *)0x0) {
      ca_filepath = info->client_ssl_ca_filepath;
    }
    iVar4 = 0;
    if (((info->options & 0x1000) != 0) && ((vhost->tls).ssl_client_ctx == (lws_tls_ctx *)0x0)) {
      if (info->provided_client_ssl_ctx == (lws_tls_ctx *)0x0) {
        plVar2 = vhost->context->pt[0].fake_wsi;
        iVar3 = lws_tls_client_create_vhost_context
                          (vhost,info,cipher_list,ca_filepath,info->client_ssl_ca_mem,
                           info->client_ssl_ca_mem_len,cert_filepath,info->client_ssl_cert_mem,
                           info->client_ssl_cert_mem_len,private_key_filepath);
        iVar4 = 1;
        if (iVar3 == 0) {
          iVar4 = 0;
          _lws_log(8,"created client ssl context for %s\n",vhost->name);
          plVar2->vhost = vhost;
          plVar2->context = vhost->context;
          plVar2->protocol = (lws_protocols *)0x0;
          (*vhost->protocols->callback)
                    (plVar2,LWS_CALLBACK_OPENSSL_LOAD_EXTRA_CLIENT_VERIFY_CERTS,
                     (vhost->tls).ssl_client_ctx,(void *)0x0,0);
        }
      }
      else {
        (vhost->tls).ssl_client_ctx = info->provided_client_ssl_ctx;
        puVar1 = &(vhost->tls).field_0x64;
        *puVar1 = *puVar1 | 1;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int lws_context_init_client_ssl(const struct lws_context_creation_info *info,
				struct lws_vhost *vhost)
{
	const char *private_key_filepath = info->ssl_private_key_filepath;
	const char *cert_filepath = info->ssl_cert_filepath;
	const char *ca_filepath = info->ssl_ca_filepath;
	const char *cipher_list = info->ssl_cipher_list;
	struct lws *wsi = vhost->context->pt[0].fake_wsi;

	if (vhost->options & LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG)
		return 0;

	if (vhost->tls.ssl_ctx) {
		cert_filepath = NULL;
		private_key_filepath = NULL;
		ca_filepath = NULL;
	}

	/*
	 *  for backwards-compatibility default to using ssl_... members, but
	 * if the newer client-specific ones are given, use those
	 */
	if (info->client_ssl_cipher_list)
		cipher_list = info->client_ssl_cipher_list;
	if (info->client_ssl_cert_filepath)
		cert_filepath = info->client_ssl_cert_filepath;
	if (info->client_ssl_private_key_filepath)
		private_key_filepath = info->client_ssl_private_key_filepath;

	if (info->client_ssl_ca_filepath)
		ca_filepath = info->client_ssl_ca_filepath;

	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT))
		return 0;

	if (vhost->tls.ssl_client_ctx)
		return 0;

	if (info->provided_client_ssl_ctx) {
		/* use the provided OpenSSL context if given one */
		vhost->tls.ssl_client_ctx = info->provided_client_ssl_ctx;
		/* nothing for lib to delete */
		vhost->tls.user_supplied_ssl_ctx = 1;

		return 0;
	}

	if (lws_tls_client_create_vhost_context(vhost, info, cipher_list,
						ca_filepath,
						info->client_ssl_ca_mem,
						info->client_ssl_ca_mem_len,
						cert_filepath,
						info->client_ssl_cert_mem,
						info->client_ssl_cert_mem_len,
						private_key_filepath))
		return 1;

	lwsl_info("created client ssl context for %s\n", vhost->name);

	/*
	 * give him a fake wsi with context set, so he can use
	 * lws_get_context() in the callback
	 */

	wsi->vhost = vhost; /* not a real bound wsi */
	wsi->context = vhost->context;
	wsi->protocol = NULL;

	vhost->protocols[0].callback(wsi,
			LWS_CALLBACK_OPENSSL_LOAD_EXTRA_CLIENT_VERIFY_CERTS,
				     vhost->tls.ssl_client_ctx, NULL, 0);

	return 0;
}